

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_number.hpp
# Opt level: O0

unsigned_short __thiscall chaiscript::Boxed_Number::get_as<unsigned_short>(Boxed_Number *this)

{
  Common_Types CVar1;
  undefined8 uVar2;
  bad_any_cast *in_RDI;
  Boxed_Value *in_stack_ffffffffffffffe8;
  bad_any_cast *this_00;
  unsigned_short local_2;
  
  this_00 = in_RDI;
  CVar1 = get_common_type(in_stack_ffffffffffffffe8);
  switch(CVar1) {
  case t_int32:
    local_2 = get_as_aux<unsigned_short,int>((Boxed_Value *)0x203867);
    break;
  case t_double:
    local_2 = get_as_aux<unsigned_short,double>((Boxed_Value *)0x203901);
    break;
  case t_uint8:
    local_2 = get_as_aux<unsigned_short,unsigned_char>((Boxed_Value *)0x20387b);
    break;
  case t_int8:
    local_2 = get_as_aux<unsigned_short,signed_char>((Boxed_Value *)0x20388f);
    break;
  case t_uint16:
    local_2 = get_as_aux<unsigned_short,unsigned_short>((Boxed_Value *)0x2038a3);
    break;
  case t_int16:
    local_2 = get_as_aux<unsigned_short,short>((Boxed_Value *)0x2038b7);
    break;
  case t_uint32:
    local_2 = get_as_aux<unsigned_short,unsigned_int>((Boxed_Value *)0x2038cb);
    break;
  case t_uint64:
    local_2 = get_as_aux<unsigned_short,unsigned_long>((Boxed_Value *)0x2038df);
    break;
  case t_int64:
    local_2 = get_as_aux<unsigned_short,long>((Boxed_Value *)0x2038f0);
    break;
  case t_float:
    local_2 = get_as_aux<unsigned_short,float>((Boxed_Value *)0x203912);
    break;
  case t_long_double:
    local_2 = get_as_aux<unsigned_short,long_double>((Boxed_Value *)in_RDI);
    break;
  default:
    uVar2 = __cxa_allocate_exception(0x28);
    chaiscript::detail::exception::bad_any_cast::bad_any_cast(this_00);
    __cxa_throw(uVar2,&chaiscript::detail::exception::bad_any_cast::typeinfo,
                chaiscript::detail::exception::bad_any_cast::~bad_any_cast);
  }
  return local_2;
}

Assistant:

Target get_as() const
      {
        switch (get_common_type(bv)) {
          case Common_Types::t_int32:
            return get_as_aux<Target, int32_t>(bv);
          case Common_Types::t_uint8:
            return get_as_aux<Target, uint8_t>(bv);
          case Common_Types::t_int8:
            return get_as_aux<Target, int8_t>(bv);
          case Common_Types::t_uint16:
            return get_as_aux<Target, uint16_t>(bv);
          case Common_Types::t_int16:
            return get_as_aux<Target, int16_t>(bv);
          case Common_Types::t_uint32:
            return get_as_aux<Target, uint32_t>(bv);
          case Common_Types::t_uint64:
            return get_as_aux<Target, uint64_t>(bv);
          case Common_Types::t_int64:
            return get_as_aux<Target, int64_t>(bv);
          case Common_Types::t_double:
            return get_as_aux<Target, double>(bv);
          case Common_Types::t_float:
            return get_as_aux<Target, float>(bv);
          case Common_Types::t_long_double:
            return get_as_aux<Target, long double>(bv);
        }

        throw chaiscript::detail::exception::bad_any_cast();
      }